

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

void oonf_layer2_origin_remove(oonf_layer2_origin *origin)

{
  list_entity *plVar1;
  bool bVar2;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_layer2_net *l2net_it;
  oonf_layer2_net *l2net;
  oonf_layer2_origin *origin_local;
  
  bVar2 = false;
  if ((origin->_node).list.next != (list_entity *)0x0) {
    bVar2 = (origin->_node).list.prev != (list_entity *)0x0;
  }
  if (bVar2) {
    l2net_it = (oonf_layer2_net *)(_oonf_layer2_net_tree.list_head.next + -0x7a);
    plVar1 = (_oonf_layer2_net_tree.list_head.next)->next;
    while (__tempptr = plVar1 + -0x7a,
          (l2net_it->_node).list.prev != _oonf_layer2_net_tree.list_head.prev) {
      oonf_layer2_net_remove(l2net_it,origin);
      l2net_it = (oonf_layer2_net *)__tempptr;
      plVar1 = plVar1->next;
    }
    avl_remove(&_oonf_originator_tree,&origin->_node);
  }
  return;
}

Assistant:

void
oonf_layer2_origin_remove(struct oonf_layer2_origin *origin) {
  struct oonf_layer2_net *l2net, *l2net_it;

  if (!avl_is_node_added(&origin->_node)) {
    return;
  }

  avl_for_each_element_safe(&_oonf_layer2_net_tree, l2net, _node, l2net_it) {
    oonf_layer2_net_remove(l2net, origin);
  }

  avl_remove(&_oonf_originator_tree, &origin->_node);
}